

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_msg * __thiscall
common_chat_parse_deepseek_r1::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,string *input)

{
  undefined1 uVar1;
  int iVar2;
  const_reference __x;
  string *in_RDX;
  common_chat_msg *in_RDI;
  common_chat_msg msg2;
  string_type tool_calls;
  smatch match;
  common_chat_msg *msg;
  undefined1 in_stack_0000037f;
  regex *in_stack_00000380;
  regex *in_stack_00000388;
  optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *in_stack_00000390;
  string *in_stack_00000398;
  common_chat_msg *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  common_chat_msg *__s;
  flag_type in_stack_fffffffffffffea4;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  string local_68 [67];
  byte local_25;
  string *local_18;
  
  __s = in_RDI;
  local_18 = in_RDX;
  if (common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
      operator()(std::__cxx11::string_const&)::function_regex_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::
                                 $_0::operator()(std::__cxx11::string_const&)::
                                 function_regex_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
                    operator()(std::__cxx11::string_const&)::function_regex_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
                           operator()(std::__cxx11::string_const&)::function_regex_abi_cxx11_);
    }
  }
  if (common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
      operator()(std::__cxx11::string_const&)::close_regex_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::
                                 $_0::operator()(std::__cxx11::string_const&)::
                                 close_regex_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
                    operator()(std::__cxx11::string_const&)::close_regex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
                           operator()(std::__cxx11::string_const&)::close_regex_abi_cxx11_);
    }
  }
  if (common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
      operator()(std::__cxx11::string_const&)::tool_calls_regex_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::
                                 $_0::operator()(std::__cxx11::string_const&)::
                                 tool_calls_regex_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
                    operator()(std::__cxx11::string_const&)::tool_calls_regex_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&common_chat_parse_deepseek_r1(std::__cxx11::string_const&,bool)::$_0::
                           operator()(std::__cxx11::string_const&)::tool_calls_regex_abi_cxx11_);
    }
  }
  local_25 = 0;
  common_chat_msg::common_chat_msg
            ((common_chat_msg *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::__cxx11::string::operator=((string *)in_RDI,"assistant");
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffe70);
  uVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (&__s->role,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_RDI,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (match_flag_type)(in_stack_fffffffffffffe78 >> 0x20));
  if ((bool)uVar1) {
    __x = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(uVar1,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(in_stack_fffffffffffffea8);
    in_stack_fffffffffffffe70 = (common_chat_msg *)&stack0xfffffffffffffea0;
    std::optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::optional();
    parse_json_tool_calls
              (in_stack_00000398,in_stack_00000390,in_stack_00000388,in_stack_00000380,
               (bool)in_stack_0000037f);
    std::optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::~optional
              ((optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
               0x27dccf);
    std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::operator=
              ((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffe80),
               (vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)__x);
    common_chat_msg::~common_chat_msg(in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_68);
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI->content,local_18);
  }
  local_25 = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x27ddfc);
  if ((local_25 & 1) == 0) {
    common_chat_msg::~common_chat_msg(in_stack_fffffffffffffe70);
  }
  return __s;
}

Assistant:

static common_chat_msg common_chat_parse_deepseek_r1(const std::string & input, bool extract_reasoning) {
    return handle_think_tag_prelude(input, extract_reasoning, [](const std::string & input) {
        static const std::regex function_regex("<｜tool▁call▁begin｜>function<｜tool▁sep｜>([^\n]+)\n```json\n");
        static const std::regex close_regex("```[\\s\\r\\n]*<｜tool▁call▁end｜>");
        static const std::regex tool_calls_regex("[\\s\\r\\n]*(?:<｜tool▁calls▁begin｜>|<｜tool_calls_begin｜>|<｜tool calls begin｜>|<｜tool\\\\_calls\\\\_begin｜>)([\\s\\S\\r\\n]*?)<｜tool▁calls▁end｜>");

        common_chat_msg msg;
        msg.role = "assistant";
        std::smatch match;
        if (std::regex_search(input, match, tool_calls_regex)) {
            auto tool_calls = match[1].str();
            auto msg2 = parse_json_tool_calls(tool_calls, std::nullopt, function_regex, close_regex);
            msg.tool_calls = std::move(msg2.tool_calls);
        } else {
            msg.content = input;
        }
        return msg;
    });
}